

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall dmlc::JSONWriter::WriteString(JSONWriter *this,string *s)

{
  char cVar1;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  
  std::operator<<(this->os_,'\"');
  uVar3 = 0;
  do {
    if (s->_M_string_length <= uVar3) {
      std::operator<<(this->os_,'\"');
      return;
    }
    cVar1 = (s->_M_dataplus)._M_p[uVar3];
    if (cVar1 == '\t') {
      pcVar2 = "\\t";
LAB_0011a0a5:
      std::operator<<(this->os_,pcVar2);
    }
    else {
      if (cVar1 == '\n') {
        pcVar2 = "\\n";
        goto LAB_0011a0a5;
      }
      if (cVar1 == '\\') {
        pcVar2 = "\\\\";
        goto LAB_0011a0a5;
      }
      if (cVar1 == '\"') {
        pcVar2 = "\\\"";
        goto LAB_0011a0a5;
      }
      if (cVar1 == '\r') {
        pcVar2 = "\\r";
        goto LAB_0011a0a5;
      }
      std::operator<<(this->os_,cVar1);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

inline void JSONWriter::WriteString(const std::string &s) {
  Extend(os_, '\"');
  for (size_t i = 0; i < s.length(); ++i) {
    char ch = s[i];
    switch (ch) {
    case '\r':
      Extend(os_, "\\r");
      break;
    case '\n':
      Extend(os_, "\\n");
      break;
    case '\\':
      Extend(os_, "\\\\");
      break;
    case '\t':
      Extend(os_, "\\t");
      break;
    case '\"':
      Extend(os_, "\\\"");
      break;
    default:
      Extend(os_, ch);
    }
  }
  Extend(os_, '\"');
}